

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::OutputWheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  bool *pbVar1;
  bool bVar2;
  int eptype_tvar_00;
  reference piVar3;
  size_type sVar4;
  size_type sVar5;
  reference ppVar6;
  int in_R9D;
  vector<int,_std::allocator<int>_> local_138;
  offset_in_OutLosses_to_subr local_120;
  vector<int,_std::allocator<int>_> local_110;
  undefined1 local_f8 [8];
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  vector<int,_std::allocator<int>_> local_b0;
  offset_in_OutLosses_to_subr local_88;
  vector<int,_std::allocator<int>_> local_78;
  int local_5c;
  const_iterator cStack_58;
  int epcalc;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator it;
  int falseCount;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  int eptype_tvar_local;
  int eptype_local;
  vector<int,_std::allocator<int>_> *handles_local;
  aggreports *this_local;
  
  it._M_current._4_4_ = 0;
  local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(handles);
  while( true ) {
    cStack_58 = std::vector<int,_std::allocator<int>_>::end(handles);
    bVar2 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa8);
    if (!bVar2) break;
    pbVar1 = this->outputFlags_;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_50);
    if ((pbVar1[*piVar3] & 1U) == 0) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_50);
  }
  if (it._M_current._4_4_ != 2) {
    local_5c = (uint)(this->ordFlag_ & 1) * 3 + (uint)((this->ordFlag_ ^ 0xffU) & 1) * 2;
    eptype_tvar_00 = (uint)(this->ordFlag_ & 1) * eptype;
    sVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
            size(&this->periodstoweighting_);
    if (sVar4 == 0) {
      std::vector<int,_std::allocator<int>_>::vector(&local_78,handles);
      local_88 = GetOutLoss;
      WheatsheafAndWheatsheafMean
                (this,&local_78,GetOutLoss,in_R9D,local_5c,eptype_tvar_00,eptype_tvar);
      std::vector<int,_std::allocator<int>_>::~vector(&local_78);
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector(&local_b0,handles);
      WheatsheafAndWheatsheafMeanWithWeighting
                (this,&local_b0,GetOutLoss,in_R9D,local_5c,eptype_tvar_00,eptype_tvar);
      std::vector<int,_std::allocator<int>_>::~vector(&local_b0);
    }
    if (((this->ordFlag_ & 1U) == 0) &&
       (sVar5 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::size(&this->ensembletosidx_), sVar5 != 0)) {
      __end2 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::begin(&this->ensembletosidx_);
      ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::end(&this->ensembletosidx_);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&ensemble.second.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data.
                                                       _M_end_of_storage), bVar2) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                 operator*(&__end2);
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_f8,ppVar6);
        sVar4 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                size(&this->periodstoweighting_);
        if (sVar4 == 0) {
          std::vector<int,_std::allocator<int>_>::vector(&local_110,handles);
          local_120 = GetOutLoss;
          WheatsheafAndWheatsheafMean
                    (this,&local_110,GetOutLoss,in_R9D,local_5c,local_f8._0_4_,eptype_tvar);
          std::vector<int,_std::allocator<int>_>::~vector(&local_110);
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector(&local_138,handles);
          WheatsheafAndWheatsheafMeanWithWeighting
                    (this,&local_138,GetOutLoss,in_R9D,local_5c,local_f8._0_4_,eptype_tvar);
          std::vector<int,_std::allocator<int>_>::~vector(&local_138);
        }
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_f8);
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void aggreports::OutputWheatsheafAndWheatsheafMean(const std::vector<int> &handles,
	int eptype, const int eptype_tvar,
	OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  int falseCount = 0;
  for (auto it = handles.begin(); it != handles.end(); ++it) {
    if (outputFlags_[*it] == false) falseCount++;
  }
  if (falseCount == 2) return;

  // EPCalc = PERSAMPLEMEAN for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * PERSAMPLEMEAN + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, eptype,
				eptype_tvar);
  } else {
    WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
					     eptype, eptype_tvar);
  }

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      if (periodstoweighting_.size() == 0) {
	WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, ensemble.first,
				    eptype_tvar, ensemble.first);
      } else {
	WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
						 ensemble.first, eptype_tvar,
						 ensemble.first);
      }
    }
  }

}